

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::disallow_forwarding_in_expression_chain
          (CompilerGLSL *this,SPIRExpression *expr)

{
  bool bVar1;
  uint32_t uVar2;
  size_type sVar3;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *this_00;
  TypedID<(spirv_cross::Types)0> *pTVar4;
  SPIRExpression *expr_00;
  bool bVar5;
  TypedID<(spirv_cross::Types)0> *dependent;
  TypedID<(spirv_cross::Types)0> *__end2;
  TypedID<(spirv_cross::Types)0> *__begin2;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *__range2;
  uint32_t local_20;
  uint32_t local_1c;
  SPIRExpression *local_18;
  SPIRExpression *expr_local;
  CompilerGLSL *this_local;
  
  local_18 = expr;
  expr_local = (SPIRExpression *)this;
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(expr->super_IVariant).self);
  bVar1 = expression_is_forwarded(this,uVar2);
  bVar5 = false;
  if (bVar1) {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(local_18->super_IVariant).self);
    bVar1 = expression_suppresses_usage_tracking(this,uVar2);
    bVar5 = false;
    if (!bVar1) {
      local_1c = TypedID::operator_cast_to_unsigned_int((TypedID *)&(local_18->super_IVariant).self)
      ;
      sVar3 = ::std::
              unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              ::count(&(this->super_Compiler).forced_invariant_temporaries,&local_1c);
      bVar5 = sVar3 == 0;
    }
  }
  if (bVar5) {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(local_18->super_IVariant).self);
    force_temporary_and_recompile(this,uVar2);
    local_20 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(local_18->super_IVariant).self);
    ::std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::insert(&(this->super_Compiler).forced_invariant_temporaries,&local_20);
    this_00 = &local_18->expression_dependencies;
    __end2 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>::begin
                       (&this_00->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>);
    pTVar4 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>::end
                       (&this_00->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>);
    for (; __end2 != pTVar4; __end2 = __end2 + 1) {
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)__end2);
      expr_00 = Compiler::get<spirv_cross::SPIRExpression>(&this->super_Compiler,uVar2);
      disallow_forwarding_in_expression_chain(this,expr_00);
    }
  }
  return;
}

Assistant:

void CompilerGLSL::disallow_forwarding_in_expression_chain(const SPIRExpression &expr)
{
	// Allow trivially forwarded expressions like OpLoad or trivial shuffles,
	// these will be marked as having suppressed usage tracking.
	// Our only concern is to make sure arithmetic operations are done in similar ways.
	if (expression_is_forwarded(expr.self) && !expression_suppresses_usage_tracking(expr.self) &&
	    forced_invariant_temporaries.count(expr.self) == 0)
	{
		force_temporary_and_recompile(expr.self);
		forced_invariant_temporaries.insert(expr.self);

		for (auto &dependent : expr.expression_dependencies)
			disallow_forwarding_in_expression_chain(get<SPIRExpression>(dependent));
	}
}